

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

void __thiscall BufferedFile::FindByte(BufferedFile *this,byte byte)

{
  ulong uVar1;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> _Var2;
  ulong uVar3;
  ulong uVar4;
  pointer pbVar5;
  long in_FS_OFFSET;
  byte local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = this->m_read_pos %
          (ulong)((long)(this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  local_39 = byte;
  do {
    if (this->m_read_pos == this->nSrcPos) {
      Fill(this);
    }
    pbVar5 = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + uVar3;
    uVar1 = (long)(this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pbVar5;
    uVar4 = this->nSrcPos - this->m_read_pos;
    if (uVar1 <= uVar4) {
      uVar4 = uVar1;
    }
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,__gnu_cxx::__ops::_Iter_equals_val<std::byte_const>>
                      (pbVar5,pbVar5 + uVar4,&local_39);
    uVar1 = (long)_Var2._M_current - (long)pbVar5;
    this->m_read_pos = this->m_read_pos + uVar1;
    if ((uVar4 <= uVar1) &&
       (uVar3 = uVar3 + uVar1,
       (ulong)((long)(this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                    .super__Vector_impl_data._M_start) <= uVar3)) {
      uVar3 = 0;
    }
  } while (uVar4 <= uVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FindByte(std::byte byte)
    {
        // For best performance, avoid mod operation within the loop.
        size_t buf_offset{size_t(m_read_pos % uint64_t(vchBuf.size()))};
        while (true) {
            if (m_read_pos == nSrcPos) {
                // No more bytes available; read from the file into the buffer,
                // setting nSrcPos to one beyond the end of the new data.
                // Throws exception if end-of-file reached.
                Fill();
            }
            const size_t len{std::min<size_t>(vchBuf.size() - buf_offset, nSrcPos - m_read_pos)};
            const auto it_start{vchBuf.begin() + buf_offset};
            const auto it_find{std::find(it_start, it_start + len, byte)};
            const size_t inc{size_t(std::distance(it_start, it_find))};
            m_read_pos += inc;
            if (inc < len) break;
            buf_offset += inc;
            if (buf_offset >= vchBuf.size()) buf_offset = 0;
        }
    }